

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O3

void Omega_h::vtk::read_vtu_ents(istream *stream,Mesh *mesh)

{
  pointer pcVar1;
  Alloc *pAVar2;
  size_t sVar3;
  void *pvVar4;
  Alloc *pAVar5;
  Comm *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  Omega_h_Family family_in;
  mapped_type *pmVar12;
  const_iterator cVar13;
  int *piVar14;
  long lVar15;
  uint uVar16;
  undefined8 uVar17;
  LO size;
  char *pcVar18;
  Tag tag6;
  Tag tag7;
  Read<double> coords;
  Tag tag5;
  Tag tag8;
  CommPtr comm;
  Tag tag3;
  Tag tag4;
  Tag tag9;
  Tag tag2;
  Tag tag10;
  Tag tag1;
  undefined1 local_488 [32];
  anon_enum_32 local_468;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_460;
  undefined1 local_430 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_408;
  Alloc *local_3d8;
  void *local_3d0;
  Alloc *local_3c8;
  void *local_3c0;
  undefined1 local_3b8 [32];
  anon_enum_32 local_398;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_390;
  undefined1 local_358 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_330;
  Alloc *local_2f8;
  void *pvStack_2f0;
  Alloc *local_2e8;
  void *pvStack_2e0;
  Comm *local_2d0;
  Alloc *local_2c8;
  pointer pcStack_2c0;
  GOs local_2b8;
  LOs local_2a8;
  GOs local_298;
  Read<double> local_288;
  GOs local_278;
  Reals local_268;
  Comm *local_258;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_250;
  undefined1 local_248 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  Tag local_1f0;
  undefined1 local_198 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  Tag local_138;
  Tag local_e0;
  Tag local_88;
  
  xml_lite::read_tag((Tag *)local_3b8,stream);
  iVar10 = std::__cxx11::string::compare((char *)local_3b8);
  if (iVar10 != 0) {
    fail("assertion %s failed at %s +%d\n","st.elem_name == \"VTKFile\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x175);
  }
  pcVar1 = local_488 + 0x10;
  local_488._16_4_ = 0x64616568;
  local_488[0x14] = 'e';
  local_488[0x15] = 'r';
  local_488[0x16] = '_';
  local_488[0x17] = 't';
  local_488._24_2_ = 0x7079;
  local_488[0x1a] = 'e';
  local_488._8_8_ = 0xb;
  local_488[0x1b] = '\0';
  local_488._0_8_ = pcVar1;
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_390,(key_type *)local_488);
  iVar10 = std::__cxx11::string::compare((char *)pmVar12);
  if (iVar10 != 0) {
    fail("assertion %s failed at %s +%d\n",
         "st.attribs[\"header_type\"] == Traits<std::uint64_t>::name()",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x176);
  }
  if ((pointer)local_488._0_8_ != pcVar1) {
    operator_delete((void *)local_488._0_8_,
                    CONCAT17(local_488[0x17],
                             CONCAT16(local_488[0x16],
                                      CONCAT15(local_488[0x15],
                                               CONCAT14(local_488[0x14],local_488._16_4_)))) + 1);
  }
  local_488._16_4_ = 0x65747962;
  local_488[0x14] = '_';
  local_488[0x15] = 'o';
  local_488[0x16] = 'r';
  local_488[0x17] = 'd';
  local_488._24_2_ = 0x7265;
  local_488._8_8_ = 10;
  local_488[0x1a] = '\0';
  local_488._0_8_ = pcVar1;
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_390,(key_type *)local_488);
  iVar10 = std::__cxx11::string::compare((char *)pmVar12);
  if ((pointer)local_488._0_8_ != pcVar1) {
    operator_delete((void *)local_488._0_8_,
                    CONCAT17(local_488[0x17],
                             CONCAT16(local_488[0x16],
                                      CONCAT15(local_488[0x15],
                                               CONCAT14(local_488[0x14],local_488._16_4_)))) + 1);
  }
  bVar6 = is_little_endian_cpu();
  local_488._16_4_ = 0x706d6f63;
  local_488[0x14] = 'r';
  local_488[0x15] = 'e';
  local_488[0x16] = 's';
  local_488[0x17] = 's';
  local_488._24_2_ = 0x726f;
  local_488._8_8_ = 10;
  local_488[0x1a] = '\0';
  local_488._0_8_ = pcVar1;
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_390,(key_type *)local_488);
  if ((pointer)local_488._0_8_ != pcVar1) {
    operator_delete((void *)local_488._0_8_,
                    CONCAT17(local_488[0x17],
                             CONCAT16(local_488[0x16],
                                      CONCAT15(local_488[0x15],
                                               CONCAT14(local_488[0x14],local_488._16_4_)))) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_390);
  if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
    operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
  }
  xml_lite::read_tag(&local_88,stream);
  iVar11 = std::__cxx11::string::compare((char *)&local_88);
  if (iVar11 != 0) {
    fail("assertion %s failed at %s +%d\n","tag1.elem_name == \"UnstructuredGrid\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x299);
  }
  xml_lite::read_tag((Tag *)local_3b8,stream);
  iVar11 = std::__cxx11::string::compare(local_3b8);
  if (iVar11 != 0) {
    fail("assertion %s failed at %s +%d\n","st.elem_name == \"Piece\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x186);
  }
  local_3d8 = (Alloc *)CONCAT71(local_3d8._1_7_,iVar10 == 0);
  local_488._16_4_ = 0x626d754e;
  local_488[0x14] = 'e';
  local_488[0x15] = 'r';
  local_488[0x16] = 'O';
  local_488[0x17] = 'f';
  local_488._24_2_ = 0x6f50;
  local_488[0x1a] = 'i';
  local_488[0x1b] = 'n';
  local_488[0x1c] = 't';
  local_488[0x1d] = 's';
  local_488._8_8_ = 0xe;
  local_488[0x1e] = '\0';
  local_488._0_8_ = pcVar1;
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_390,(key_type *)local_488);
  pcVar18 = (pmVar12->_M_dataplus)._M_p;
  piVar14 = __errno_location();
  iVar10 = *piVar14;
  *piVar14 = 0;
  lVar15 = strtol(pcVar18,(char **)&local_138,10);
  if (local_138.elem_name._M_dataplus._M_p == pcVar18) {
    std::__throw_invalid_argument("stoi");
LAB_0041b1b1:
    std::__throw_out_of_range("stoi");
LAB_0041b1bd:
    std::__throw_invalid_argument("stoi");
  }
  else {
    if (((int)lVar15 != lVar15) || (*piVar14 == 0x22)) goto LAB_0041b1b1;
    if (*piVar14 == 0) {
      *piVar14 = iVar10;
    }
    local_3d0 = (void *)lVar15;
    if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
      operator_delete((void *)local_488._0_8_,
                      CONCAT17(local_488[0x17],
                               CONCAT16(local_488[0x16],
                                        CONCAT15(local_488[0x15],
                                                 CONCAT14(local_488[0x14],local_488._16_4_)))) + 1);
    }
    local_488._16_4_ = 0x626d754e;
    local_488[0x14] = 'e';
    local_488[0x15] = 'r';
    local_488[0x16] = 'O';
    local_488[0x17] = 'f';
    local_488._24_2_ = 0x6543;
    local_488[0x1a] = 'l';
    local_488[0x1b] = 'l';
    local_488[0x1c] = 's';
    local_488._8_8_ = 0xd;
    local_488[0x1d] = '\0';
    local_488._0_8_ = local_488 + 0x10;
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_390,(key_type *)local_488);
    pcVar18 = (pmVar12->_M_dataplus)._M_p;
    iVar10 = *piVar14;
    *piVar14 = 0;
    lVar15 = strtol(pcVar18,(char **)&local_138,10);
    if (local_138.elem_name._M_dataplus._M_p == pcVar18) goto LAB_0041b1bd;
    if ((0xfffffffeffffffff < lVar15 - 0x80000000U) && (*piVar14 != 0x22)) {
      pcVar1 = local_488 + 0x10;
      if (*piVar14 == 0) {
        *piVar14 = iVar10;
      }
      if ((pointer)local_488._0_8_ != pcVar1) {
        operator_delete((void *)local_488._0_8_,
                        CONCAT17(local_488[0x17],
                                 CONCAT16(local_488[0x16],
                                          CONCAT15(local_488[0x15],
                                                   CONCAT14(local_488[0x14],local_488._16_4_)))) + 1
                       );
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_390);
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
      }
      xml_lite::read_tag(&local_138,stream);
      iVar10 = std::__cxx11::string::compare((char *)&local_138);
      if (iVar10 == 0) {
        Omega_h::Mesh::comm(mesh);
        this_00 = local_250;
        local_2c8 = (Alloc *)0x0;
        pcStack_2c0 = (pointer)0x0;
        if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_250->_M_use_count = local_250->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_250->_M_use_count = local_250->_M_use_count + 1;
          }
        }
        local_1f0.elem_name._M_dataplus._M_p = (pointer)&local_1f0.elem_name.field_2;
        local_1f0.elem_name.field_2._M_allocated_capacity._0_4_ = 0x65707974;
        local_1f0.elem_name.field_2._M_allocated_capacity._4_2_ = 0x73;
        local_1f0.elem_name._M_string_length = 5;
        xml_lite::read_tag((Tag *)local_3b8,stream);
        iVar10 = std::__cxx11::string::compare(local_3b8);
        if (iVar10 == 0) {
          if (local_398 == START) {
            local_488._16_4_ = 0x656d614e;
            local_488._8_8_ = 4;
            local_488[0x14] = '\0';
            local_488._0_8_ = pcVar1;
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_390,(key_type *)local_488);
            sVar3 = pmVar12->_M_string_length;
            if ((sVar3 != local_1f0.elem_name._M_string_length) ||
               ((sVar3 != 0 &&
                (iVar10 = bcmp((pmVar12->_M_dataplus)._M_p,local_1f0.elem_name._M_dataplus._M_p,
                               sVar3), iVar10 != 0)))) {
              fail("assertion %s failed at %s +%d\n","st.attribs[\"Name\"] == name",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                   ,0x148);
            }
            if ((pointer)local_488._0_8_ != pcVar1) {
              operator_delete((void *)local_488._0_8_,
                              CONCAT17(local_488[0x17],
                                       CONCAT16(local_488[0x16],
                                                CONCAT15(local_488[0x15],
                                                         CONCAT14(local_488[0x14],local_488._16_4_))
                                               )) + 1);
            }
            local_488._16_4_ = 0x65707974;
            local_488._8_8_ = 4;
            local_488[0x14] = '\0';
            local_488._0_8_ = pcVar1;
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_390,(key_type *)local_488);
            iVar10 = std::__cxx11::string::compare((char *)pmVar12);
            if (iVar10 != 0) {
              fail("assertion %s failed at %s +%d\n","st.attribs[\"type\"] == Traits<T>::name()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                   ,0x149);
            }
            if ((pointer)local_488._0_8_ != pcVar1) {
              operator_delete((void *)local_488._0_8_,
                              CONCAT17(local_488[0x17],
                                       CONCAT16(local_488[0x16],
                                                CONCAT15(local_488[0x15],
                                                         CONCAT14(local_488[0x14],local_488._16_4_))
                                               )) + 1);
            }
            local_2d0 = local_258;
            local_248._0_8_ = (pointer)0x12;
            local_488._0_8_ = pcVar1;
            local_488._0_8_ = std::__cxx11::string::_M_create((ulong *)local_488,(ulong)local_248);
            local_488._16_4_ = (undefined4)local_248._0_8_;
            local_488[0x14] = SUB81(local_248._0_8_,4);
            local_488[0x15] = SUB81(local_248._0_8_,5);
            local_488[0x16] = SUB81(local_248._0_8_,6);
            local_488[0x17] = SUB81(local_248._0_8_,7);
            ((Alloc *)local_488._0_8_)->size = 0x664f7265626d754e;
            (((Alloc *)local_488._0_8_)->name)._M_dataplus._M_p = (pointer)0x6e656e6f706d6f43;
            *(undefined2 *)&(((Alloc *)local_488._0_8_)->name)._M_string_length = 0x7374;
            local_488._8_8_ = local_248._0_8_;
            *(char *)(local_248._0_8_ + (long)&((Alloc *)local_488._0_8_)->size) = '\0';
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_390,(key_type *)local_488);
            local_248._0_8_ = local_248 + 0x10;
            std::__cxx11::string::_M_construct((ulong)local_248,'\x01');
            *(char *)local_248._0_8_ = '1';
            uVar17 = local_248._0_8_;
            sVar3 = pmVar12->_M_string_length;
            if ((sVar3 != local_248._8_8_) ||
               ((sVar3 != 0 &&
                (iVar10 = bcmp((pmVar12->_M_dataplus)._M_p,(void *)local_248._0_8_,sVar3),
                iVar10 != 0)))) {
              fail("assertion %s failed at %s +%d\n",
                   "st.attribs[\"NumberOfComponents\"] == std::to_string(ncomps)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                   ,0x14a);
            }
            if ((Alloc *)uVar17 != (Alloc *)(local_248 + 0x10)) {
              operator_delete((void *)uVar17,local_248._16_8_ + 1);
            }
            bVar6 = (bool)((byte)local_3d8 ^ bVar6);
            if ((Alloc *)local_488._0_8_ != (Alloc *)(local_488 + 0x10)) {
              operator_delete((void *)local_488._0_8_,
                              CONCAT17(local_488[0x17],
                                       CONCAT16(local_488[0x16],
                                                CONCAT15(local_488[0x15],
                                                         CONCAT14(local_488[0x14],local_488._16_4_))
                                               )) + 1);
            }
            size = (LO)lVar15;
            read_array<signed_char>
                      ((vtk *)local_430,stream,size,bVar6,
                       (_Rb_tree_header *)cVar13._M_node != &local_390._M_impl.super__Rb_tree_header
                      );
            xml_lite::read_tag((Tag *)local_488,stream);
            iVar10 = std::__cxx11::string::compare(local_488);
            if (iVar10 == 0) {
              if (local_468 == END) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_460);
                if ((Alloc *)local_488._0_8_ != (Alloc *)(local_488 + 0x10)) {
                  operator_delete((void *)local_488._0_8_,
                                  CONCAT17(local_488[0x17],
                                           CONCAT16(local_488[0x16],
                                                    CONCAT15(local_488[0x15],
                                                             CONCAT14(local_488[0x14],
                                                                      local_488._16_4_)))) + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~_Rb_tree(&local_390);
                if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
                  operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0.elem_name._M_dataplus._M_p != &local_1f0.elem_name.field_2) {
                  operator_delete(local_1f0.elem_name._M_dataplus._M_p,
                                  CONCAT26(local_1f0.elem_name.field_2._M_allocated_capacity._6_2_,
                                           CONCAT24(local_1f0.elem_name.field_2.
                                                    _M_allocated_capacity._4_2_,
                                                    local_1f0.elem_name.field_2.
                                                    _M_allocated_capacity._0_4_)) + 1);
                }
                if ((local_430._0_8_ & 1) == 0) {
                  iVar10 = *(int *)local_430._0_8_;
                }
                else {
                  iVar10 = (int)((ulong)local_430._0_8_ >> 3);
                }
                if (iVar10 == 0) {
                  iVar11 = -1;
                  iVar10 = 0;
                }
                else {
                  bVar7 = Read<signed_char>::get((Read<signed_char> *)local_430,0);
                  uVar16 = bVar7 - 3;
                  if ((9 < (byte)uVar16) || ((0x2c5U >> (uVar16 & 0x1f) & 1) == 0)) {
                    fail("Unexpected VTK type %d\n",(ulong)(uint)(int)(char)bVar7);
                  }
                  uVar16 = (uVar16 & 0xff) << 2;
                  iVar10 = *(int *)(&DAT_0044fd4c + uVar16);
                  iVar11 = *(int *)(&DAT_0044fd74 + uVar16);
                }
                this = local_2d0;
                family_in = Comm::allreduce<int>(local_2d0,iVar10,OMEGA_H_MAX);
                uVar16 = Comm::allreduce<int>(this,iVar11,OMEGA_H_MAX);
                if (family_in == OMEGA_H_SIMPLEX) {
                  iVar10 = -1;
                  if (uVar16 < 4) {
                    iVar10 = uVar16 + 1;
                  }
                }
                else {
                  iVar10 = -1;
                  if (uVar16 < 4) {
                    iVar10 = *(int *)(&DAT_00442ba8 + (ulong)uVar16 * 4);
                  }
                }
                local_3b8._16_8_ = 0x697463656e6e6f63;
                local_3b8._24_4_ = 0x79746976;
                local_3b8._8_8_ = 0xc;
                local_3b8[0x1c] = '\0';
                local_3b8._0_8_ = local_3b8 + 0x10;
                read_known_array<int>
                          ((istream *)local_488,(string *)stream,(LO)local_3b8,iVar10 * size,bVar6,
                           (_Rb_tree_header *)cVar13._M_node !=
                           &local_390._M_impl.super__Rb_tree_header);
                if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
                  operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
                }
                pAVar2 = local_2c8;
                if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
                  piVar14 = &local_2c8->use_count;
                  *piVar14 = *piVar14 + -1;
                  if (*piVar14 == 0) {
                    Alloc::~Alloc(local_2c8);
                    operator_delete(pAVar2,0x48);
                  }
                }
                local_2c8 = (Alloc *)local_488._0_8_;
                if ((local_488._0_8_ & 7) == 0 && (Alloc *)local_488._0_8_ != (Alloc *)0x0) {
                  if (entering_parallel == '\x01') {
                    local_2c8 = (Alloc *)(*(long *)local_488._0_8_ * 8 + 1);
                  }
                  else {
                    *(int *)(local_488._0_8_ + 0x30) = *(int *)(local_488._0_8_ + 0x30) + 1;
                  }
                }
                local_2d0 = (Comm *)local_488._8_8_;
                pcStack_2c0 = (pointer)local_488._8_8_;
                local_3b8._0_8_ = local_3b8 + 0x10;
                local_3b8._8_8_ = (void *)0x7;
                local_3b8._16_8_ = 0x7374657366666f;
                local_3d8 = local_2c8;
                read_known_array<int>
                          ((istream *)local_248,(string *)stream,(LO)local_3b8,size,bVar6,
                           (_Rb_tree_header *)cVar13._M_node !=
                           &local_390._M_impl.super__Rb_tree_header);
                uVar17 = local_248._0_8_;
                if ((local_248._0_8_ & 7) == 0 && (Alloc *)local_248._0_8_ != (Alloc *)0x0) {
                  piVar14 = (int *)(local_248._0_8_ + 0x30);
                  *piVar14 = *piVar14 + -1;
                  if (*piVar14 == 0) {
                    Alloc::~Alloc((Alloc *)local_248._0_8_);
                    operator_delete((void *)uVar17,0x48);
                  }
                }
                if ((Alloc *)local_3b8._0_8_ != (Alloc *)(local_3b8 + 0x10)) {
                  operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
                }
                uVar17 = local_488._0_8_;
                if ((local_488._0_8_ & 7) == 0 && (Alloc *)local_488._0_8_ != (Alloc *)0x0) {
                  piVar14 = (int *)(local_488._0_8_ + 0x30);
                  *piVar14 = *piVar14 + -1;
                  if (*piVar14 == 0) {
                    Alloc::~Alloc((Alloc *)local_488._0_8_);
                    operator_delete((void *)uVar17,0x48);
                  }
                }
                if ((local_430._0_8_ & 7) == 0 && (Alloc *)local_430._0_8_ != (Alloc *)0x0) {
                  piVar14 = (int *)(local_430._0_8_ + 0x30);
                  *piVar14 = *piVar14 + -1;
                  if (*piVar14 == 0) {
                    Alloc::~Alloc((Alloc *)local_430._0_8_);
                    operator_delete((void *)local_430._0_8_,0x48);
                  }
                }
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                }
                Omega_h::Mesh::set_family(mesh,family_in);
                pcVar1 = local_488 + 0x10;
                Omega_h::Mesh::set_dim(mesh,uVar16);
                xml_lite::read_tag((Tag *)local_248,stream);
                iVar10 = std::__cxx11::string::compare(local_248);
                if (iVar10 != 0) {
                  fail("assertion %s failed at %s +%d\n","tag3.elem_name == \"Cells\"",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                       ,0x2a7);
                }
                xml_lite::read_tag(&local_1f0,stream);
                iVar10 = std::__cxx11::string::compare((char *)&local_1f0);
                if (iVar10 != 0) {
                  fail("assertion %s failed at %s +%d\n","tag4.elem_name == \"Points\"",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                       ,0x2a9);
                }
                local_358._0_8_ = local_358 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_358,"coordinates","");
                xml_lite::read_tag((Tag *)local_3b8,stream);
                iVar10 = std::__cxx11::string::compare(local_3b8);
                if (iVar10 == 0) {
                  if (local_398 == START) {
                    local_488._16_4_ = 0x656d614e;
                    local_488._8_8_ = 4;
                    local_488[0x14] = '\0';
                    local_488._0_8_ = pcVar1;
                    pmVar12 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&local_390,(key_type *)local_488);
                    pvVar4 = (void *)pmVar12->_M_string_length;
                    if ((pvVar4 != (void *)local_358._8_8_) ||
                       ((pvVar4 != (void *)0x0 &&
                        (iVar10 = bcmp((pmVar12->_M_dataplus)._M_p,(void *)local_358._0_8_,
                                       (size_t)pvVar4), iVar10 != 0)))) {
                      fail("assertion %s failed at %s +%d\n","st.attribs[\"Name\"] == name",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                           ,0x148);
                    }
                    if ((pointer)local_488._0_8_ != pcVar1) {
                      operator_delete((void *)local_488._0_8_,
                                      CONCAT17(local_488[0x17],
                                               CONCAT16(local_488[0x16],
                                                        CONCAT15(local_488[0x15],
                                                                 CONCAT14(local_488[0x14],
                                                                          local_488._16_4_)))) + 1);
                    }
                    local_488._16_4_ = 0x65707974;
                    local_488._8_8_ = 4;
                    local_488[0x14] = '\0';
                    local_488._0_8_ = pcVar1;
                    pmVar12 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&local_390,(key_type *)local_488);
                    iVar10 = std::__cxx11::string::compare((char *)pmVar12);
                    if (iVar10 != 0) {
                      fail("assertion %s failed at %s +%d\n",
                           "st.attribs[\"type\"] == Traits<T>::name()",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                           ,0x149);
                    }
                    if ((pointer)local_488._0_8_ != pcVar1) {
                      operator_delete((void *)local_488._0_8_,
                                      CONCAT17(local_488[0x17],
                                               CONCAT16(local_488[0x16],
                                                        CONCAT15(local_488[0x15],
                                                                 CONCAT14(local_488[0x14],
                                                                          local_488._16_4_)))) + 1);
                    }
                    local_430._0_8_ = (Alloc *)0x12;
                    local_488._0_8_ = pcVar1;
                    local_488._0_8_ =
                         std::__cxx11::string::_M_create((ulong *)local_488,(ulong)local_430);
                    local_488._16_4_ = (undefined4)local_430._0_8_;
                    local_488[0x14] = SUB81(local_430._0_8_,4);
                    local_488[0x15] = SUB81(local_430._0_8_,5);
                    local_488[0x16] = SUB81(local_430._0_8_,6);
                    local_488[0x17] = SUB81(local_430._0_8_,7);
                    builtin_strncpy((char *)local_488._0_8_,"NumberOfComponents",0x12);
                    local_488._8_8_ = local_430._0_8_;
                    *(char *)(local_488._0_8_ + local_430._0_8_) = '\0';
                    pmVar12 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&local_390,(key_type *)local_488);
                    local_430._0_8_ = local_430 + 0x10;
                    std::__cxx11::string::_M_construct((ulong)local_430,'\x01');
                    *(char *)local_430._0_8_ = '3';
                    uVar17 = local_430._0_8_;
                    pvVar4 = (void *)pmVar12->_M_string_length;
                    if ((pvVar4 != (void *)local_430._8_8_) ||
                       ((pvVar4 != (void *)0x0 &&
                        (iVar10 = bcmp((pmVar12->_M_dataplus)._M_p,(void *)local_430._0_8_,
                                       (size_t)pvVar4), iVar10 != 0)))) {
                      fail("assertion %s failed at %s +%d\n",
                           "st.attribs[\"NumberOfComponents\"] == std::to_string(ncomps)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                           ,0x14a);
                    }
                    if ((Alloc *)uVar17 != (Alloc *)(local_430 + 0x10)) {
                      operator_delete((void *)uVar17,local_430._16_8_ + 1);
                    }
                    if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
                      operator_delete((void *)local_488._0_8_,
                                      CONCAT17(local_488[0x17],
                                               CONCAT16(local_488[0x16],
                                                        CONCAT15(local_488[0x15],
                                                                 CONCAT14(local_488[0x14],
                                                                          local_488._16_4_)))) + 1);
                    }
                    read_array<double>((vtk *)&local_3c8,stream,(int)local_3d0 * 3,bVar6,
                                       (_Rb_tree_header *)cVar13._M_node !=
                                       &local_390._M_impl.super__Rb_tree_header);
                    xml_lite::read_tag((Tag *)local_488,stream);
                    iVar10 = std::__cxx11::string::compare(local_488);
                    if (iVar10 == 0) {
                      if (local_468 == END) {
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_460);
                        if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
                          operator_delete((void *)local_488._0_8_,
                                          CONCAT17(local_488[0x17],
                                                   CONCAT16(local_488[0x16],
                                                            CONCAT15(local_488[0x15],
                                                                     CONCAT14(local_488[0x14],
                                                                              local_488._16_4_)))) +
                                          1);
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_390);
                        if ((Alloc *)local_3b8._0_8_ != (Alloc *)(local_3b8 + 0x10)) {
                          operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
                        }
                        if ((Alloc *)local_358._0_8_ != (Alloc *)(local_358 + 0x10)) {
                          operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
                        }
                        if ((int)uVar16 < 3) {
                          local_268.write_.shared_alloc_.alloc = local_3c8;
                          if (((ulong)local_3c8 & 7) == 0 && local_3c8 != (Alloc *)0x0) {
                            if (entering_parallel == '\x01') {
                              local_268.write_.shared_alloc_.alloc =
                                   (Alloc *)(local_3c8->size * 8 + 1);
                            }
                            else {
                              local_3c8->use_count = local_3c8->use_count + 1;
                            }
                          }
                          local_268.write_.shared_alloc_.direct_ptr = local_3c0;
                          resize_vectors((Omega_h *)local_3b8,&local_268,3,uVar16);
                          if (((ulong)local_3c8 & 7) == 0 && local_3c8 != (Alloc *)0x0) {
                            piVar14 = &local_3c8->use_count;
                            *piVar14 = *piVar14 + -1;
                            if (*piVar14 == 0) {
                              Alloc::~Alloc(local_3c8);
                              operator_delete(local_3c8,0x48);
                            }
                          }
                          local_3c8 = (Alloc *)local_3b8._0_8_;
                          local_3c0 = (void *)local_3b8._8_8_;
                          if (((local_3b8._0_8_ & 7) == 0 &&
                               (Alloc *)local_3b8._0_8_ != (Alloc *)0x0) &&
                             (entering_parallel == '\x01')) {
                            *(int *)(local_3b8._0_8_ + 0x30) = *(int *)(local_3b8._0_8_ + 0x30) + -1
                            ;
                            local_3c8 = (Alloc *)(*(long *)local_3b8._0_8_ * 8 + 1);
                          }
                          pAVar2 = local_268.write_.shared_alloc_.alloc;
                          local_3b8._0_8_ = (Alloc *)0x0;
                          local_3b8._8_8_ = (void *)0x0;
                          if (((ulong)local_268.write_.shared_alloc_.alloc & 7) == 0 &&
                              local_268.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                            piVar14 = &(local_268.write_.shared_alloc_.alloc)->use_count;
                            *piVar14 = *piVar14 + -1;
                            if (*piVar14 == 0) {
                              Alloc::~Alloc(local_268.write_.shared_alloc_.alloc);
                              operator_delete(pAVar2,0x48);
                            }
                          }
                        }
                        xml_lite::read_tag((Tag *)local_3b8,stream);
                        iVar10 = std::__cxx11::string::compare(local_3b8);
                        if (iVar10 != 0) {
                          fail("assertion %s failed at %s +%d\n","tag5.elem_name == \"Points\"",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                               ,0x2ae);
                        }
                        xml_lite::read_tag((Tag *)local_488,stream);
                        iVar10 = std::__cxx11::string::compare(local_488);
                        if (iVar10 != 0) {
                          fail("assertion %s failed at %s +%d\n","tag6.elem_name == \"PointData\"",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                               ,0x2b0);
                        }
                        local_2f8 = (Alloc *)0x0;
                        pvStack_2f0 = (void *)0x0;
                        bVar8 = Omega_h::Mesh::could_be_shared(mesh,0);
                        if (bVar8) {
                          local_430._0_8_ = local_430 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_430,"global","");
                          read_known_array<long>
                                    ((istream *)local_358,(string *)stream,(LO)local_430,
                                     (Int)local_3d0,bVar6,
                                     (_Rb_tree_header *)cVar13._M_node !=
                                     &local_390._M_impl.super__Rb_tree_header);
                        }
                        else {
                          local_430._0_8_ = local_430 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"");
                          Read<long>::Read((Read<long> *)local_358,(LO)local_3d0,0,1,
                                           (string *)local_430);
                        }
                        uVar17 = local_358._8_8_;
                        local_2f8 = (Alloc *)local_358._0_8_;
                        pvStack_2f0 = (void *)local_358._8_8_;
                        if (((local_358._0_8_ & 7) == 0 && (Alloc *)local_358._0_8_ != (Alloc *)0x0)
                           && (entering_parallel == '\x01')) {
                          *(int *)(local_358._0_8_ + 0x30) = *(int *)(local_358._0_8_ + 0x30) + -1;
                          local_2f8 = (Alloc *)(*(long *)local_358._0_8_ * 8 + 1);
                        }
                        pAVar2 = local_2f8;
                        local_358._0_8_ = (Alloc *)0x0;
                        local_358._8_8_ = (void *)0x0;
                        if ((Alloc *)local_430._0_8_ != (Alloc *)(local_430 + 0x10)) {
                          operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
                        }
                        bVar8 = ((ulong)pAVar2 & 7) == 0;
                        local_278.write_.shared_alloc_.alloc = pAVar2;
                        if (bVar8 && pAVar2 != (Alloc *)0x0) {
                          if (entering_parallel == '\x01') {
                            local_278.write_.shared_alloc_.alloc = (Alloc *)(pAVar2->size * 8 + 1);
                          }
                          else {
                            pAVar2->use_count = pAVar2->use_count + 1;
                          }
                        }
                        local_3d0 = (void *)uVar17;
                        local_278.write_.shared_alloc_.direct_ptr = (void *)uVar17;
                        build_verts_from_globals(mesh,&local_278);
                        pAVar5 = local_278.write_.shared_alloc_.alloc;
                        if (((ulong)local_278.write_.shared_alloc_.alloc & 7) == 0 &&
                            local_278.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                          piVar14 = &(local_278.write_.shared_alloc_.alloc)->use_count;
                          *piVar14 = *piVar14 + -1;
                          if (*piVar14 == 0) {
                            Alloc::~Alloc(pAVar5);
                            operator_delete(pAVar5,0x48);
                          }
                        }
                        local_430._0_8_ = local_430 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_430,"coordinates","");
                        local_288.write_.shared_alloc_.alloc = local_3c8;
                        if (((ulong)local_3c8 & 7) == 0 && local_3c8 != (Alloc *)0x0) {
                          if (entering_parallel == '\x01') {
                            local_288.write_.shared_alloc_.alloc =
                                 (Alloc *)(local_3c8->size * 8 + 1);
                          }
                          else {
                            local_3c8->use_count = local_3c8->use_count + 1;
                          }
                        }
                        local_288.write_.shared_alloc_.direct_ptr = local_3c0;
                        Omega_h::Mesh::add_tag<double>
                                  (mesh,0,(string *)local_430,uVar16,&local_288,true);
                        pAVar5 = local_288.write_.shared_alloc_.alloc;
                        if (((ulong)local_288.write_.shared_alloc_.alloc & 7) == 0 &&
                            local_288.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                          piVar14 = &(local_288.write_.shared_alloc_.alloc)->use_count;
                          *piVar14 = *piVar14 + -1;
                          if (*piVar14 == 0) {
                            Alloc::~Alloc(pAVar5);
                            operator_delete(pAVar5,0x48);
                          }
                        }
                        if ((Alloc *)local_430._0_8_ != (Alloc *)(local_430 + 0x10)) {
                          operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
                        }
                        do {
                          bVar9 = read_tag(stream,mesh,0,bVar6,
                                           (_Rb_tree_header *)cVar13._M_node !=
                                           &local_390._M_impl.super__Rb_tree_header);
                        } while (bVar9);
                        local_430._0_8_ = local_430 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_430,"local","");
                        Omega_h::Mesh::remove_tag(mesh,0,(string *)local_430);
                        if ((Alloc *)local_430._0_8_ != (Alloc *)(local_430 + 0x10)) {
                          operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
                        }
                        local_430._0_8_ = local_430 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_430,"owner","");
                        Omega_h::Mesh::remove_tag(mesh,0,(string *)local_430);
                        if ((Alloc *)local_430._0_8_ != (Alloc *)(local_430 + 0x10)) {
                          operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
                        }
                        xml_lite::read_tag((Tag *)local_430,stream);
                        iVar10 = std::__cxx11::string::compare(local_430);
                        if (iVar10 != 0) {
                          fail("assertion %s failed at %s +%d\n","tag7.elem_name == \"CellData\"",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                               ,0x2bf);
                        }
                        local_2e8 = (Alloc *)0x0;
                        pvStack_2e0 = (void *)0x0;
                        bVar9 = Omega_h::Mesh::could_be_shared(mesh,uVar16);
                        if (bVar9) {
                          local_358._0_8_ = local_358 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_358,"global","");
                          read_known_array<long>
                                    ((istream *)local_198,(string *)stream,(LO)local_358,size,bVar6,
                                     (_Rb_tree_header *)cVar13._M_node !=
                                     &local_390._M_impl.super__Rb_tree_header);
                        }
                        else {
                          local_358._0_8_ = local_358 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"");
                          Read<long>::Read((Read<long> *)local_198,size,0,1,(string *)local_358);
                        }
                        uVar17 = local_198._8_8_;
                        local_2e8 = (Alloc *)local_198._0_8_;
                        pvStack_2e0 = (void *)local_198._8_8_;
                        if (((local_198._0_8_ & 7) == 0 && (Alloc *)local_198._0_8_ != (Alloc *)0x0)
                           && (entering_parallel == '\x01')) {
                          *(int *)(local_198._0_8_ + 0x30) = *(int *)(local_198._0_8_ + 0x30) + -1;
                          local_2e8 = (Alloc *)(*(long *)local_198._0_8_ * 8 + 1);
                        }
                        pAVar5 = local_2e8;
                        local_198._0_8_ = (Alloc *)0x0;
                        local_198._8_8_ = (void *)0x0;
                        if ((Alloc *)local_358._0_8_ != (Alloc *)(local_358 + 0x10)) {
                          operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
                        }
                        local_2a8.write_.shared_alloc_.alloc = local_3d8;
                        if (((ulong)local_3d8 & 7) == 0 && local_3d8 != (Alloc *)0x0) {
                          if (entering_parallel == '\x01') {
                            local_2a8.write_.shared_alloc_.alloc =
                                 (Alloc *)(local_3d8->size * 8 + 1);
                          }
                          else {
                            local_3d8->use_count = local_3d8->use_count + 1;
                          }
                        }
                        local_2a8.write_.shared_alloc_.direct_ptr = local_2d0;
                        local_2b8.write_.shared_alloc_.alloc = pAVar2;
                        if (bVar8 && pAVar2 != (Alloc *)0x0) {
                          if (entering_parallel == '\x01') {
                            local_2b8.write_.shared_alloc_.alloc = (Alloc *)(pAVar2->size * 8 + 1);
                          }
                          else {
                            pAVar2->use_count = pAVar2->use_count + 1;
                          }
                        }
                        local_2b8.write_.shared_alloc_.direct_ptr = local_3d0;
                        bVar8 = ((ulong)pAVar5 & 7) == 0;
                        local_298.write_.shared_alloc_.alloc = pAVar5;
                        if (bVar8 && pAVar5 != (Alloc *)0x0) {
                          if (entering_parallel == '\x01') {
                            local_298.write_.shared_alloc_.alloc = (Alloc *)(pAVar5->size * 8 + 1);
                          }
                          else {
                            pAVar5->use_count = pAVar5->use_count + 1;
                          }
                        }
                        local_298.write_.shared_alloc_.direct_ptr = (void *)uVar17;
                        build_ents_from_elems2verts(mesh,&local_2a8,&local_2b8,&local_298);
                        pAVar2 = local_298.write_.shared_alloc_.alloc;
                        if (((ulong)local_298.write_.shared_alloc_.alloc & 7) == 0 &&
                            local_298.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                          piVar14 = &(local_298.write_.shared_alloc_.alloc)->use_count;
                          *piVar14 = *piVar14 + -1;
                          if (*piVar14 == 0) {
                            Alloc::~Alloc(local_298.write_.shared_alloc_.alloc);
                            operator_delete(pAVar2,0x48);
                          }
                        }
                        pAVar2 = local_2b8.write_.shared_alloc_.alloc;
                        if (((ulong)local_2b8.write_.shared_alloc_.alloc & 7) == 0 &&
                            local_2b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                          piVar14 = &(local_2b8.write_.shared_alloc_.alloc)->use_count;
                          *piVar14 = *piVar14 + -1;
                          if (*piVar14 == 0) {
                            Alloc::~Alloc(pAVar2);
                            operator_delete(pAVar2,0x48);
                          }
                        }
                        pAVar2 = local_2a8.write_.shared_alloc_.alloc;
                        if (((ulong)local_2a8.write_.shared_alloc_.alloc & 7) == 0 &&
                            local_2a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                          piVar14 = &(local_2a8.write_.shared_alloc_.alloc)->use_count;
                          *piVar14 = *piVar14 + -1;
                          if (*piVar14 == 0) {
                            Alloc::~Alloc(local_2a8.write_.shared_alloc_.alloc);
                            operator_delete(pAVar2,0x48);
                          }
                        }
                        do {
                          bVar9 = read_tag(stream,mesh,uVar16,bVar6,
                                           (_Rb_tree_header *)cVar13._M_node !=
                                           &local_390._M_impl.super__Rb_tree_header);
                        } while (bVar9);
                        pAVar2 = (Alloc *)(local_358 + 0x10);
                        local_358._0_8_ = pAVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_358,"local","");
                        Omega_h::Mesh::remove_tag(mesh,uVar16,(string *)local_358);
                        if ((Alloc *)local_358._0_8_ != pAVar2) {
                          operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
                        }
                        local_358._0_8_ = pAVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_358,"owner","");
                        Omega_h::Mesh::remove_tag(mesh,uVar16,(string *)local_358);
                        if ((Alloc *)local_358._0_8_ != pAVar2) {
                          operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
                        }
                        xml_lite::read_tag((Tag *)local_358,stream);
                        iVar10 = std::__cxx11::string::compare(local_358);
                        if (iVar10 != 0) {
                          fail("assertion %s failed at %s +%d\n","tag8.elem_name == \"Piece\"",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                               ,0x2cd);
                        }
                        xml_lite::read_tag((Tag *)local_198,stream);
                        iVar10 = std::__cxx11::string::compare(local_198);
                        if (iVar10 != 0) {
                          fail("assertion %s failed at %s +%d\n",
                               "tag9.elem_name == \"UnstructuredGrid\"",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                               ,0x2cf);
                        }
                        xml_lite::read_tag(&local_e0,stream);
                        iVar10 = std::__cxx11::string::compare((char *)&local_e0);
                        if (iVar10 != 0) {
                          fail("assertion %s failed at %s +%d\n","tag10.elem_name == \"VTKFile\"",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                               ,0x2d1);
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_e0.attribs._M_t);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_e0.elem_name._M_dataplus._M_p != &local_e0.elem_name.field_2) {
                          operator_delete(local_e0.elem_name._M_dataplus._M_p,
                                          local_e0.elem_name.field_2._M_allocated_capacity + 1);
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_170);
                        if ((Alloc *)local_198._0_8_ != (Alloc *)(local_198 + 0x10)) {
                          operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_330);
                        if ((Alloc *)local_358._0_8_ != pAVar2) {
                          operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
                        }
                        if (bVar8 && pAVar5 != (Alloc *)0x0) {
                          piVar14 = &pAVar5->use_count;
                          *piVar14 = *piVar14 + -1;
                          if (*piVar14 == 0) {
                            Alloc::~Alloc(pAVar5);
                            operator_delete(pAVar5,0x48);
                          }
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_408);
                        if ((Alloc *)local_430._0_8_ != (Alloc *)(local_430 + 0x10)) {
                          operator_delete((void *)local_430._0_8_,local_430._16_8_ + 1);
                        }
                        pAVar2 = local_2f8;
                        if (((ulong)local_2f8 & 7) == 0 && local_2f8 != (Alloc *)0x0) {
                          piVar14 = &local_2f8->use_count;
                          *piVar14 = *piVar14 + -1;
                          if (*piVar14 == 0) {
                            Alloc::~Alloc(pAVar2);
                            operator_delete(pAVar2,0x48);
                          }
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_460);
                        if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
                          operator_delete((void *)local_488._0_8_,
                                          CONCAT17(local_488[0x17],
                                                   CONCAT16(local_488[0x16],
                                                            CONCAT15(local_488[0x15],
                                                                     CONCAT14(local_488[0x14],
                                                                              local_488._16_4_)))) +
                                          1);
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_390);
                        if ((Alloc *)local_3b8._0_8_ != (Alloc *)(local_3b8 + 0x10)) {
                          operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
                        }
                        pAVar2 = local_3c8;
                        if (((ulong)local_3c8 & 7) == 0 && local_3c8 != (Alloc *)0x0) {
                          piVar14 = &local_3c8->use_count;
                          *piVar14 = *piVar14 + -1;
                          if (*piVar14 == 0) {
                            Alloc::~Alloc(local_3c8);
                            operator_delete(pAVar2,0x48);
                          }
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_1f0.attribs._M_t);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1f0.elem_name._M_dataplus._M_p != &local_1f0.elem_name.field_2)
                        {
                          operator_delete(local_1f0.elem_name._M_dataplus._M_p,
                                          CONCAT26(local_1f0.elem_name.field_2._M_allocated_capacity
                                                   ._6_2_,CONCAT24(local_1f0.elem_name.field_2.
                                                                   _M_allocated_capacity._4_2_,
                                                                   local_1f0.elem_name.field_2.
                                                                   _M_allocated_capacity._0_4_)) + 1
                                         );
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_220);
                        if ((Alloc *)local_248._0_8_ != (Alloc *)(local_248 + 0x10)) {
                          operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
                        }
                        pAVar2 = local_2c8;
                        if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
                          piVar14 = &local_2c8->use_count;
                          *piVar14 = *piVar14 + -1;
                          if (*piVar14 == 0) {
                            Alloc::~Alloc(local_2c8);
                            operator_delete(pAVar2,0x48);
                          }
                        }
                        if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250);
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_138.attribs._M_t);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138.elem_name._M_dataplus._M_p != &local_138.elem_name.field_2)
                        {
                          operator_delete(local_138.elem_name._M_dataplus._M_p,
                                          local_138.elem_name.field_2._M_allocated_capacity + 1);
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~_Rb_tree(&local_88.attribs._M_t);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_88.elem_name._M_dataplus._M_p != &local_88.elem_name.field_2) {
                          operator_delete(local_88.elem_name._M_dataplus._M_p,
                                          local_88.elem_name.field_2._M_allocated_capacity + 1);
                        }
                        return;
                      }
                      uVar17 = 0x14f;
                      pcVar18 = "et.type == xml_lite::Tag::END";
                    }
                    else {
                      uVar17 = 0x14e;
                      pcVar18 = "et.elem_name == \"DataArray\"";
                    }
                    fail("assertion %s failed at %s +%d\n",pcVar18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                         ,uVar17);
                  }
                  uVar17 = 0x147;
                  pcVar18 = "st.type == xml_lite::Tag::START";
                }
                else {
                  uVar17 = 0x146;
                  pcVar18 = "st.elem_name == \"DataArray\"";
                }
                fail("assertion %s failed at %s +%d\n",pcVar18,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                     ,uVar17);
              }
              uVar17 = 0x14f;
              pcVar18 = "et.type == xml_lite::Tag::END";
            }
            else {
              uVar17 = 0x14e;
              pcVar18 = "et.elem_name == \"DataArray\"";
            }
            fail("assertion %s failed at %s +%d\n",pcVar18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                 ,uVar17);
          }
          uVar17 = 0x147;
          pcVar18 = "st.type == xml_lite::Tag::START";
        }
        else {
          uVar17 = 0x146;
          pcVar18 = "st.elem_name == \"DataArray\"";
        }
        fail("assertion %s failed at %s +%d\n",pcVar18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,uVar17);
      }
      goto LAB_0041b1d5;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0041b1d5:
  fail("assertion %s failed at %s +%d\n","tag2.elem_name == \"Cells\"",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
       ,0x29d);
}

Assistant:

void read_vtu_ents(std::istream& stream, Mesh* mesh) {
  bool needs_swapping, is_compressed;
  read_vtkfile_vtu_start_tag(stream, &needs_swapping, &is_compressed);
  auto tag1 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag1.elem_name == "UnstructuredGrid");
  LO nverts, ncells;
  read_piece_start_tag(stream, &nverts, &ncells);
  auto tag2 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag2.elem_name == "Cells");
  auto comm = mesh->comm();
  Omega_h_Family family;
  Int dim;
  LOs ev2v;
  read_connectivity(stream, comm, ncells, needs_swapping, is_compressed,
      &family, &dim, &ev2v);
  mesh->set_family(family);
  mesh->set_dim(dim);
  auto tag3 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag3.elem_name == "Cells");
  auto tag4 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag4.elem_name == "Points");
  auto coords = read_known_array<Real>(
      stream, "coordinates", nverts, 3, needs_swapping, is_compressed);
  if (dim < 3) coords = resize_vectors(coords, 3, dim);
  auto tag5 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag5.elem_name == "Points");
  auto tag6 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag6.elem_name == "PointData");
  GOs vert_globals;
  if (mesh->could_be_shared(VERT)) {
    vert_globals = read_known_array<GO>(
        stream, "global", nverts, 1, needs_swapping, is_compressed);
  } else {
    vert_globals = Read<GO>(nverts, 0, 1);
  }
  build_verts_from_globals(mesh, vert_globals);
  mesh->add_tag(VERT, "coordinates", dim, coords, true);
  while (read_tag(stream, mesh, VERT, needs_swapping, is_compressed))
    ;
  mesh->remove_tag(VERT, "local");
  mesh->remove_tag(VERT, "owner");
  auto tag7 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag7.elem_name == "CellData");
  GOs elem_globals;
  if (mesh->could_be_shared(dim)) {
    elem_globals = read_known_array<GO>(
        stream, "global", ncells, 1, needs_swapping, is_compressed);
  } else {
    elem_globals = Read<GO>(ncells, 0, 1);
  }
  build_ents_from_elems2verts(mesh, ev2v, vert_globals, elem_globals);
  while (read_tag(stream, mesh, dim, needs_swapping, is_compressed))
    ;
  mesh->remove_tag(dim, "local");
  mesh->remove_tag(dim, "owner");
  auto tag8 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag8.elem_name == "Piece");
  auto tag9 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag9.elem_name == "UnstructuredGrid");
  auto tag10 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag10.elem_name == "VTKFile");
}